

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_show_aqr(REF_INT m,REF_INT n,REF_DBL *a,REF_DBL *q,REF_DBL *r)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong local_60;
  
  if (a == (REF_DBL *)0x0) {
    local_60 = 0;
    uVar4 = 0;
    if (0 < n) {
      uVar4 = (ulong)(uint)n;
    }
    if (0 < m) {
      local_60 = (ulong)(uint)m;
    }
  }
  else {
    puts("A");
    uVar2 = 0;
    uVar4 = 0;
    if (0 < n) {
      uVar4 = (ulong)(uint)n;
    }
    local_60 = (ulong)(uint)m;
    if (m < 1) {
      local_60 = uVar2;
    }
    for (; uVar3 = uVar4, pRVar1 = a, uVar2 != local_60; uVar2 = uVar2 + 1) {
      while (uVar3 != 0) {
        printf(" %12.4e",*pRVar1);
        uVar3 = uVar3 - 1;
        pRVar1 = pRVar1 + m;
      }
      putchar(10);
      a = a + 1;
    }
  }
  puts("Q");
  for (uVar2 = 0; pRVar1 = q, uVar3 = uVar4, uVar2 != local_60; uVar2 = uVar2 + 1) {
    while (uVar3 != 0) {
      printf(" %12.4e",*pRVar1);
      pRVar1 = pRVar1 + m;
      uVar3 = uVar3 - 1;
    }
    putchar(10);
    q = q + 1;
  }
  puts("R");
  for (uVar2 = 0; pRVar1 = r, uVar3 = (ulong)(uint)n, uVar2 != uVar4; uVar2 = uVar2 + 1) {
    while (uVar3 != 0) {
      printf(" %12.4e",*pRVar1);
      pRVar1 = pRVar1 + n;
      uVar3 = uVar3 - 1;
    }
    putchar(10);
    r = r + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_aqr(REF_INT m, REF_INT n, REF_DBL *a,
                                       REF_DBL *q, REF_DBL *r) {
  REF_INT row, col;

  if (NULL != a) {
    printf("A\n");
    for (row = 0; row < m; row++) {
      for (col = 0; col < n; col++) {
        printf(" %12.4e", a[row + m * col]);
      }
      printf("\n");
    }
  }
  printf("Q\n");
  for (row = 0; row < m; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", q[row + m * col]);
    }
    printf("\n");
  }
  printf("R\n");
  for (row = 0; row < n; row++) {
    for (col = 0; col < n; col++) {
      printf(" %12.4e", r[row + n * col]);
    }
    printf("\n");
  }

  return REF_SUCCESS;
}